

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umemstream.h
# Opt level: O3

void __thiscall umemstream::umemstream(umemstream *this,char *p,size_t l)

{
  undefined1 *this_00;
  
  this_00 = &(this->super_istream).field_0x50;
  std::ios_base::ios_base((ios_base *)this_00);
  *(undefined8 *)&this->field_0x128 = 0;
  *(undefined2 *)&this->field_0x130 = 0;
  *(undefined8 *)&this->field_0x138 = 0;
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  (this->super_istream)._vptr_basic_istream = (_func_int **)0x1a9758;
  *(undefined8 *)&(this->super_istream).field_0x50 = 0x1a9780;
  (this->super_istream)._M_gcount = 0;
  std::ios::init((streambuf *)this_00);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__umemstream_001a9708;
  *(undefined ***)&(this->super_istream).field_0x50 = &PTR__umemstream_001a9730;
  *(code **)&(this->super_istream).field_0x10 = std::streambuf::overflow;
  *(undefined8 *)&(this->super_istream).field_0x18 = 0;
  *(undefined8 *)&(this->super_istream).field_0x20 = 0;
  *(undefined8 *)&(this->super_istream).field_0x28 = 0;
  *(undefined8 *)&(this->super_istream).field_0x30 = 0;
  *(undefined8 *)&(this->super_istream).field_0x38 = 0;
  *(undefined8 *)&(this->super_istream).field_0x40 = 0;
  std::locale::locale((locale *)&(this->super_istream).field_0x48);
  *(undefined ***)&(this->super_istream).field_0x10 = &PTR__streambuf_001a97b8;
  *(char **)&(this->super_istream).field_0x18 = p;
  *(char **)&(this->super_istream).field_0x20 = p;
  *(char **)&(this->super_istream).field_0x28 = p + l;
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_istream)._vptr_basic_istream +
                  (long)(this->super_istream)._vptr_basic_istream[-3]));
  return;
}

Assistant:

umemstream(const char *p, size_t l) : std::istream(&buffer_),
    buffer_(p, l) {
    rdbuf(&buffer_);
  }